

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O0

aiScene * ImportModel(ImportData *imp,string *path)

{
  bool bVar1;
  clock_t cVar2;
  char *pcVar3;
  clock_t cVar4;
  double seconds;
  clock_t second;
  aiScene *scene;
  clock_t first;
  string *path_local;
  ImportData *imp_local;
  
  if ((imp->log & 1U) != 0) {
    SetLogStreams(imp);
  }
  printf("Launching asset import ...           OK\n");
  bVar1 = Assimp::Importer::ValidateFlags(globalImporter,imp->ppFlags);
  if (bVar1) {
    printf("Validating postprocessing flags ...  OK\n");
    if ((imp->showLog & 1U) != 0) {
      PrintHorBar();
    }
    cVar2 = clock();
    imp_local = (ImportData *)Assimp::Importer::ReadFile(globalImporter,path,imp->ppFlags);
    if ((imp->showLog & 1U) != 0) {
      PrintHorBar();
    }
    if ((aiScene *)imp_local == (aiScene *)0x0) {
      pcVar3 = Assimp::Importer::GetErrorString(globalImporter);
      printf("ERROR: Failed to load file: %s\n",pcVar3);
      imp_local = (ImportData *)0x0;
    }
    else {
      cVar4 = clock();
      printf("Importing file ...                   OK \n   import took approx. %.5f seconds\n\n",
             (double)(cVar4 - cVar2) / 1000000.0);
      if ((imp->log & 1U) != 0) {
        FreeLogStreams();
      }
    }
  }
  else {
    printf("ERROR: Unsupported post-processing flags \n");
    imp_local = (ImportData *)0x0;
  }
  return (aiScene *)imp_local;
}

Assistant:

const aiScene* ImportModel(
	const ImportData& imp, 
	const std::string& path)
{
	// Attach log streams
	if (imp.log) {
		SetLogStreams(imp);
	}
	printf("Launching asset import ...           OK\n");

	// Now validate this flag combination
	if(!globalImporter->ValidateFlags(imp.ppFlags)) {
		printf("ERROR: Unsupported post-processing flags \n");
		return NULL;
	}
	printf("Validating postprocessing flags ...  OK\n");
	if (imp.showLog) {
		PrintHorBar();
	}
		

	// do the actual import, measure time
	const clock_t first = clock();
	const aiScene* scene = globalImporter->ReadFile(path,imp.ppFlags);

	if (imp.showLog) {
		PrintHorBar();
	}
	if (!scene) {
		printf("ERROR: Failed to load file: %s\n", globalImporter->GetErrorString());
		return NULL;
	}

	const clock_t second = ::clock();
	const double seconds = static_cast<double>(second-first) / CLOCKS_PER_SEC;

	printf("Importing file ...                   OK \n   import took approx. %.5f seconds\n"
		"\n",seconds);

	if (imp.log) { 
		FreeLogStreams();
	}
	return scene;
}